

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O0

int cea708_add_cc_data(cea708_t *cea708,int valid,cea708_cc_type_t type,uint16_t cc_data)

{
  bool bVar1;
  ushort uVar2;
  uint16_t cc_data_local;
  cea708_cc_type_t type_local;
  int valid_local;
  cea708_t *cea708_local;
  uint local_4;
  
  bVar1 = (*(ushort *)&cea708->user_data >> 3 & 0x1f) < 0x1f;
  if (bVar1) {
    uVar2 = *(ushort *)&cea708->user_data >> 3 & 0x1f;
    (cea708->user_data).cc_data[uVar2] =
         (cc_data_t)((uint)(cea708->user_data).cc_data[uVar2] & 0xffffffe0 | 0x1f);
    uVar2 = *(ushort *)&cea708->user_data >> 3 & 0x1f;
    (cea708->user_data).cc_data[uVar2] =
         (cc_data_t)((uint)(cea708->user_data).cc_data[uVar2] & 0xffffffdf | (valid & 1U) << 5);
    uVar2 = *(ushort *)&cea708->user_data >> 3 & 0x1f;
    (cea708->user_data).cc_data[uVar2] =
         (cc_data_t)
         ((uint)(cea708->user_data).cc_data[uVar2] & 0xffffff3f |
         (type & cc_type_dtvcc_packet_start) << 6);
    uVar2 = *(ushort *)&cea708->user_data >> 3 & 0x1f;
    (cea708->user_data).cc_data[uVar2] =
         (cc_data_t)((uint)(cea708->user_data).cc_data[uVar2] & 0xff0000ff | (uint)cc_data << 8);
    *(ushort *)&cea708->user_data =
         *(ushort *)&cea708->user_data & 0xff07 |
         ((*(ushort *)&cea708->user_data >> 3 & 0x1f) + 1 & 0x1f) << 3;
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

int cea708_add_cc_data(cea708_t* cea708, int valid, cea708_cc_type_t type, uint16_t cc_data)
{
    if (31 <= cea708->user_data.cc_count) {
        return 0;
    }

    cea708->user_data.cc_data[cea708->user_data.cc_count].marker_bits = 0x1F;
    cea708->user_data.cc_data[cea708->user_data.cc_count].cc_valid = valid;
    cea708->user_data.cc_data[cea708->user_data.cc_count].cc_type = type;
    cea708->user_data.cc_data[cea708->user_data.cc_count].cc_data = cc_data;
    ++cea708->user_data.cc_count;
    return 1;
}